

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

_argument_lists * __thiscall
gl4cts::GPUShaderFP64Test8::getArgumentListsForVariableType
          (_argument_lists *__return_storage_ptr__,GPUShaderFP64Test8 *this,
          _variable_type *variable_type)

{
  int iVar1;
  undefined4 uVar2;
  _argument_lists *this_00;
  uint uVar3;
  _variable_type _Var4;
  uint uVar5;
  size_type sVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  _argument_list_tree_node *p_Var10;
  _argument_list_tree_nodes leaf_nodes;
  _argument_list_tree_node *current_node_ptr;
  _argument_list_tree_node *p_Stack_d0;
  pointer local_c8;
  _argument_lists *local_c0;
  _argument_list_tree_node local_b8;
  _argument_list_tree_node_queue nodes_queue;
  
  local_c0 = __return_storage_ptr__;
  uVar3 = Utils::getNumberOfComponentsForVariableType(*variable_type);
  local_b8.parent = (_argument_list_tree_node *)0x0;
  local_b8.children.
  super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.children.
  super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  local_b8.children.
  super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  local_b8.children.
  super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_b8._20_8_ = 0;
  local_b8.type = *variable_type;
  std::
  queue<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*,std::deque<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*,std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*>>>
  ::
  queue<std::deque<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*,std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*>>,void>
            (&nodes_queue);
  leaf_nodes.
  super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_b8;
  std::
  deque<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*,std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*>>
  ::emplace_back<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*>
            ((deque<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*,std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*>>
              *)&nodes_queue,(_argument_list_tree_node **)&leaf_nodes);
  do {
    p_Var10 = *nodes_queue.c.
               super__Deque_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
    std::
    deque<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
    ::pop_front(&nodes_queue.c);
    iVar1 = p_Var10->n_components_used;
    _Var4 = p_Var10->type;
    if ((_Var4 - VARIABLE_TYPE_DMAT2 < 0x1a) &&
       ((0x3fe01ffU >> (_Var4 - VARIABLE_TYPE_DMAT2 & 0x1f) & 1) != 0)) {
      for (lVar7 = 0; lVar7 != 0x24; lVar7 = lVar7 + 4) {
        uVar2 = *(undefined4 *)((long)&DAT_01694770 + lVar7);
        leaf_nodes.
        super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x30);
        *leaf_nodes.
         super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
         ._M_impl.super__Vector_impl_data._M_start = (_argument_list_tree_node *)0x0;
        leaf_nodes.
        super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
        ._M_impl.super__Vector_impl_data._M_start[1] = (_argument_list_tree_node *)0x0;
        leaf_nodes.
        super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
        ._M_impl.super__Vector_impl_data._M_start[2] = (_argument_list_tree_node *)0x0;
        *(uint *)(leaf_nodes.
                  super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
                  ._M_impl.super__Vector_impl_data._M_start + 3) = uVar3;
        leaf_nodes.
        super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
        ._M_impl.super__Vector_impl_data._M_start[4] = p_Var10;
        *(undefined4 *)
         (leaf_nodes.
          super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
          ._M_impl.super__Vector_impl_data._M_start + 5) = uVar2;
        std::
        vector<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
        ::push_back(&p_Var10->children,(value_type *)&leaf_nodes);
      }
      _Var4 = p_Var10->type;
    }
    if ((VARIABLE_TYPE_MAT4X3 < _Var4) || ((0x7fc03fe0U >> (_Var4 & VARIABLE_TYPE_UINT) & 1) == 0))
    {
      for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 4) {
        _Var4 = *(_variable_type *)((long)&DAT_01695290 + lVar7);
        uVar5 = Utils::getNumberOfComponentsForVariableType(_Var4);
        if ((int)uVar5 <= (int)(uVar3 - iVar1)) {
          leaf_nodes.
          super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x30);
          leaf_nodes.
          super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
          ._M_impl.super__Vector_impl_data._M_start[2] = (_argument_list_tree_node *)0x0;
          *leaf_nodes.
           super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
           ._M_impl.super__Vector_impl_data._M_start = (_argument_list_tree_node *)0x0;
          leaf_nodes.
          super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
          ._M_impl.super__Vector_impl_data._M_start[1] = (_argument_list_tree_node *)0x0;
          *(uint *)(leaf_nodes.
                    super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
                    ._M_impl.super__Vector_impl_data._M_start + 3) =
               uVar5 + p_Var10->n_components_used;
          leaf_nodes.
          super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
          ._M_impl.super__Vector_impl_data._M_start[4] = p_Var10;
          *(_variable_type *)
           (leaf_nodes.
            super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
            ._M_impl.super__Vector_impl_data._M_start + 5) = _Var4;
          std::
          vector<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
          ::push_back(&p_Var10->children,(value_type *)&leaf_nodes);
          std::
          deque<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
          ::push_back(&nodes_queue.c,(value_type *)&leaf_nodes);
        }
      }
    }
    sVar6 = std::
            deque<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
            ::size(&nodes_queue.c);
  } while (sVar6 != 0);
  leaf_nodes.
  super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  leaf_nodes.
  super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  leaf_nodes.
  super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  current_node_ptr = &local_b8;
  std::
  deque<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*,std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*>>
  ::emplace_back<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*>
            ((deque<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*,std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*>>
              *)&nodes_queue,&current_node_ptr);
  do {
    current_node_ptr =
         *nodes_queue.c.
          super__Deque_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur;
    std::
    deque<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
    ::pop_front(&nodes_queue.c);
    uVar9 = (long)(current_node_ptr->children).
                  super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(current_node_ptr->children).
                  super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    if (uVar9 == 0) {
      std::
      vector<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
      ::push_back(&leaf_nodes,&current_node_ptr);
    }
    else {
      for (uVar8 = 0; (uVar9 & 0x7fffffff8) != uVar8; uVar8 = uVar8 + 8) {
        std::
        deque<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
        ::push_back(&nodes_queue.c,
                    (value_type *)
                    ((long)(current_node_ptr->children).
                           super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar8));
      }
    }
    sVar6 = std::
            deque<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
            ::size(&nodes_queue.c);
    this_00 = local_c0;
  } while (sVar6 != 0);
  uVar9 = (long)leaf_nodes.
                super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)leaf_nodes.
                super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
  (local_c0->
  super__Vector_base<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>,_std::allocator<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_c0->
  super__Vector_base<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>,_std::allocator<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_c0->
  super__Vector_base<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>,_std::allocator<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (uVar8 = 0; uVar8 != (uVar9 >> 3 & 0xffffffff); uVar8 = uVar8 + 1) {
    local_c8 = (pointer)0x0;
    current_node_ptr = (_argument_list_tree_node *)0x0;
    p_Stack_d0 = (_argument_list_tree_node *)0x0;
    p_Var10 = leaf_nodes.
              super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar8];
    do {
      if (p_Var10 != &local_b8) {
        if (p_Stack_d0 == current_node_ptr) {
          std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>
          ::push_back((vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>
                       *)&current_node_ptr,&p_Var10->type);
        }
        else {
          std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>
          ::insert((vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>
                    *)&current_node_ptr,(const_iterator)current_node_ptr,&p_Var10->type);
        }
      }
      p_Var10 = p_Var10->parent;
    } while (p_Var10 != (_argument_list_tree_node *)0x0);
    std::
    vector<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>,_std::allocator<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>_>_>
    ::push_back(this_00,(value_type *)&current_node_ptr);
    std::_Vector_base<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>
    ::~_Vector_base((_Vector_base<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>
                     *)&current_node_ptr);
  }
  std::
  _Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
  ::~_Vector_base(&leaf_nodes.
                   super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
                 );
  std::
  _Deque_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
  ::~_Deque_base((_Deque_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
                  *)&nodes_queue);
  _argument_list_tree_node::~_argument_list_tree_node(&local_b8);
  return this_00;
}

Assistant:

GPUShaderFP64Test8::_argument_lists GPUShaderFP64Test8::getArgumentListsForVariableType(
	const Utils::_variable_type& variable_type)
{
	const Utils::_variable_type matrix_types[] = {
		Utils::VARIABLE_TYPE_DMAT2, Utils::VARIABLE_TYPE_DMAT2X3, Utils::VARIABLE_TYPE_DMAT2X4,
		Utils::VARIABLE_TYPE_DMAT3, Utils::VARIABLE_TYPE_DMAT3X2, Utils::VARIABLE_TYPE_DMAT3X4,
		Utils::VARIABLE_TYPE_DMAT4, Utils::VARIABLE_TYPE_DMAT4X2, Utils::VARIABLE_TYPE_DMAT4X3,
	};
	const Utils::_variable_type scalar_types[] = { Utils::VARIABLE_TYPE_DOUBLE, Utils::VARIABLE_TYPE_DVEC2,
												   Utils::VARIABLE_TYPE_DVEC3, Utils::VARIABLE_TYPE_DVEC4 };
	const unsigned int n_matrix_types	 = sizeof(matrix_types) / sizeof(matrix_types[0]);
	const unsigned int n_scalar_types	 = sizeof(scalar_types) / sizeof(scalar_types[0]);
	const int		   n_total_components = (int)Utils::getNumberOfComponentsForVariableType(variable_type);

	/* Construct the argument list tree root. Each node carries a counter that tells how many components
	 * have already been assigned. Nodes that eat up all components are considered leaves and do not have
	 * any children. Otherwise, each node is assigned as many children, as there are types that could be
	 * used to define a subsequent argument, and its counter is increased by the amount of components
	 * described by the type.
	 */
	_argument_list_tree_node root;

	root.n_components_used = 0;
	root.parent			   = NULL;
	root.type			   = variable_type;

	/* Fill till all leaves use up all available components */
	_argument_list_tree_node_queue nodes_queue;

	nodes_queue.push(&root);

	do
	{
		/* Pop the first item in the queue */
		_argument_list_tree_node* current_node_ptr = nodes_queue.front();
		nodes_queue.pop();

		/* Matrix variable types can be defined by a combination of non-matrix variable types OR
		 * a single matrix variable type.
		 *
		 * Let's handle the latter case first.
		 */
		const int n_components_remaining = n_total_components - current_node_ptr->n_components_used;

		if (Utils::isMatrixVariableType(current_node_ptr->type))
		{
			/* Iterate through all known matrix types. All the types can be used
			 * as a constructor, assuming only one value is used to define new matrix's
			 * contents. */
			for (unsigned int n_matrix_type = 0; n_matrix_type < n_matrix_types; ++n_matrix_type)
			{
				Utils::_variable_type new_argument_type = matrix_types[n_matrix_type];

				/* Construct a new child node. Since GLSL spec clearly states we must not use more
				 * than one constructor argument if the only argument is a matrix type, mark the node
				 * as if it defined all available components.
				 */
				_argument_list_tree_node* new_subnode = new _argument_list_tree_node;

				new_subnode->n_components_used = n_total_components;
				new_subnode->parent			   = current_node_ptr;
				new_subnode->type			   = new_argument_type;

				/* Add the descriptor to node list but do not add it to the queue. This would be
				 * a redundant operation, since no new children nodes would have been assigned to
				 * this node anyway.
				 */
				current_node_ptr->children.push_back(new_subnode);
			} /* for (all matrix types) */
		}	 /* if (current node's type is a matrix) */

		/* Now for a combination of non-matrix variable types.. */
		if (!Utils::isMatrixVariableType(current_node_ptr->type))
		{
			/* Iterate through all known scalar types */
			for (unsigned int n_scalar_type = 0; n_scalar_type < n_scalar_types; ++n_scalar_type)
			{
				Utils::_variable_type new_argument_type = scalar_types[n_scalar_type];
				const int n_new_argument_components = Utils::getNumberOfComponentsForVariableType(new_argument_type);

				/* Only use the scalar type if we don't exceed the amount of components we can define
				 * for requested type.
				 */
				if (n_new_argument_components <= n_components_remaining)
				{
					/* Form new node descriptor */
					_argument_list_tree_node* new_subnode = new _argument_list_tree_node;

					new_subnode->n_components_used = n_new_argument_components + current_node_ptr->n_components_used;
					new_subnode->parent			   = current_node_ptr;
					new_subnode->type			   = new_argument_type;

					current_node_ptr->children.push_back(new_subnode);
					nodes_queue.push(new_subnode);
				}
			} /* for (all scalar types) */
		}	 /* if (!Utils::isMatrixVariableType(current_node_ptr->type) ) */
	} while (nodes_queue.size() > 0);

	/* To construct the argument lists, traverse the tree. Each path from root to child
	 * gives us a single argument list.
	 *
	 * First, identify leaf nodes.
	 */
	_argument_list_tree_nodes leaf_nodes;

	nodes_queue.push(&root);

	do
	{
		_argument_list_tree_node* current_node_ptr = nodes_queue.front();
		nodes_queue.pop();

		if (current_node_ptr->children.size() == 0)
		{
			/* This is a leaf node !*/
			leaf_nodes.push_back(current_node_ptr);
		}
		else
		{
			/* Throw all children nodes to the queue */
			const unsigned int n_children_nodes = (const unsigned int)current_node_ptr->children.size();

			for (unsigned int n_children_node = 0; n_children_node < n_children_nodes; ++n_children_node)
			{
				nodes_queue.push(current_node_ptr->children[n_children_node]);
			} /* for (all children nodes) */
		}
	} while (nodes_queue.size() > 0);

	/* For all leaf nodes, move up the tree and construct the argument lists. */
	const unsigned int n_leaf_nodes = (const unsigned int)leaf_nodes.size();
	_argument_lists	result;

	for (unsigned int n_leaf_node = 0; n_leaf_node < n_leaf_nodes; ++n_leaf_node)
	{
		_argument_list			  argument_list;
		_argument_list_tree_node* current_node_ptr = leaf_nodes[n_leaf_node];

		do
		{
			if (current_node_ptr != &root)
			{
				if (argument_list.size() == 0)
				{
					argument_list.push_back(current_node_ptr->type);
				}
				else
				{
					argument_list.insert(argument_list.begin(), current_node_ptr->type);
				}
			}

			current_node_ptr = current_node_ptr->parent;
		} while (current_node_ptr != NULL);

		result.push_back(argument_list);
	} /* for (all leaf nodes) */

	return result;
}